

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_uc_to_curlcode(CURLUcode uc)

{
  undefined4 local_c;
  CURLUcode uc_local;
  
  if (uc == CURLUE_UNSUPPORTED_SCHEME) {
    local_c = CURLE_UNSUPPORTED_PROTOCOL;
  }
  else if (uc == CURLUE_OUT_OF_MEMORY) {
    local_c = CURLE_OUT_OF_MEMORY;
  }
  else if (uc == CURLUE_USER_NOT_ALLOWED) {
    local_c = CURLE_LOGIN_DENIED;
  }
  else {
    local_c = CURLE_URL_MALFORMAT;
  }
  return local_c;
}

Assistant:

CURLcode Curl_uc_to_curlcode(CURLUcode uc)
{
  switch(uc) {
  default:
    return CURLE_URL_MALFORMAT;
  case CURLUE_UNSUPPORTED_SCHEME:
    return CURLE_UNSUPPORTED_PROTOCOL;
  case CURLUE_OUT_OF_MEMORY:
    return CURLE_OUT_OF_MEMORY;
  case CURLUE_USER_NOT_ALLOWED:
    return CURLE_LOGIN_DENIED;
  }
}